

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O1

REF_STATUS
ref_phys_viscous(REF_DBL *state,REF_DBL *grad,REF_DBL turb,REF_DBL mach,REF_DBL re,
                REF_DBL reference_temp,REF_DBL *dir,REF_DBL *flux)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  double *pdVar8;
  long lVar9;
  REF_STATUS RVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  long lVar14;
  undefined8 uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  REF_DBL qdot [3];
  REF_DBL tau [3] [3];
  double local_98 [4];
  double local_78 [9];
  
  dVar2 = *state;
  dVar3 = state[1];
  dVar4 = state[2];
  dVar5 = state[3];
  dVar6 = state[4];
  if (reference_temp <= 0.0) {
    dVar17 = 1.0;
  }
  else {
    dVar16 = (dVar6 * 1.4) / dVar2;
    if (dVar16 < 0.0) {
      dVar17 = sqrt(dVar16);
    }
    else {
      dVar17 = SQRT(dVar16);
    }
    dVar17 = ((110.56 / reference_temp + 1.0) / (110.56 / reference_temp + dVar16)) * dVar16 *
             dVar17;
  }
  dVar16 = 0.0;
  bVar7 = true;
  if (((turb <= 0.0) || (dVar2 <= 0.0)) || (dVar19 = dVar17 / dVar2, dVar19 <= 0.0)) {
    uVar15 = 0;
  }
  else {
    dVar18 = dVar19 * 1e+20;
    if (dVar18 <= -dVar18) {
      dVar18 = -dVar18;
    }
    uVar15 = 0;
    if (dVar18 <= turb) {
      uVar15 = 4;
      bVar7 = false;
    }
    else {
      dVar16 = pow(turb / dVar19,3.0);
      dVar16 = turb * dVar2 * (dVar16 / (dVar16 + 357.91099999999994));
    }
  }
  RVar10 = (REF_STATUS)uVar15;
  if (bVar7) {
    dVar19 = (dVar17 + dVar16) * (mach / re);
    pdVar1 = grad + 3;
    pdVar8 = local_78;
    lVar9 = 0;
    pdVar11 = pdVar1;
    pdVar12 = pdVar1;
    do {
      lVar14 = 0;
      pdVar13 = pdVar11;
      do {
        pdVar8[lVar14] = (pdVar12[lVar14] + *pdVar13) * dVar19;
        lVar14 = lVar14 + 1;
        pdVar13 = pdVar13 + 3;
      } while (lVar14 != 3);
      dVar18 = local_78[lVar9 * 4];
      lVar14 = 0;
      pdVar13 = pdVar1;
      do {
        dVar18 = dVar18 + *pdVar13 * dVar19 * -0.6666666666666666;
        pdVar13 = pdVar13 + 4;
        lVar14 = lVar14 + 0x18;
      } while (lVar14 != 0x48);
      local_78[lVar9 * 4] = dVar18;
      lVar9 = lVar9 + 1;
      pdVar12 = pdVar12 + 3;
      pdVar8 = pdVar8 + 3;
      pdVar11 = pdVar11 + 1;
    } while (lVar9 != 3);
    lVar9 = 0;
    do {
      local_98[lVar9] =
           ((((grad[lVar9 + 0xc] * dVar2 + grad[lVar9] * -dVar6) * 1.4) / dVar2) / dVar2) *
           (mach / re) * -(dVar16 / 0.35999999999999993 + dVar17 / 0.2879999999999999);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    *flux = 0.0;
    flux[1] = dir[2] * local_78[2] + *dir * local_78[0] + dir[1] * local_78[1];
    flux[2] = dir[2] * local_78[5] + *dir * local_78[3] + dir[1] * local_78[4];
    flux[3] = dir[2] * local_78[8] + *dir * local_78[6] + dir[1] * local_78[7];
    flux[4] = ((dVar5 * local_78[8] + dVar3 * local_78[6] + dVar4 * local_78[7]) - local_98[2]) *
              dir[2] + ((local_78[2] * dVar5 + local_78[0] * dVar3 + local_78[1] * dVar4) -
                       local_98[0]) * *dir +
                       ((local_78[5] * dVar5 + local_78[3] * dVar3 + local_78[4] * dVar4) -
                       local_98[1]) * dir[1];
    RVar10 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0xfb,
           "ref_phys_viscous",uVar15);
  }
  return RVar10;
}

Assistant:

REF_FCN REF_STATUS ref_phys_viscous(REF_DBL *state, REF_DBL *grad, REF_DBL turb,
                                    REF_DBL mach, REF_DBL re,
                                    REF_DBL reference_temp, REF_DBL *dir,
                                    REF_DBL *flux) {
  REF_DBL rho, u, v, w, p, mu, mu_t, t;
  REF_DBL gamma = 1.4;
  REF_DBL pr = 0.72;
  REF_DBL turbulent_pr = 0.90;
  REF_DBL tau[3][3], qdot[3];
  REF_INT i, j, k;
  REF_DBL thermal_conductivity, dtdx;

  rho = state[0];
  u = state[1];
  v = state[2];
  w = state[3];
  p = state[4];
  t = gamma * p / rho;

  RSS(viscosity_law(t, reference_temp, &mu), "sutherlands");
  RSS(ref_phys_mut_sa(turb, rho, mu / rho, &mu_t), "eddy viscosity");
  thermal_conductivity =
      -(mu / (pr * (gamma - 1.0)) + mu_t / (turbulent_pr * (gamma - 1.0)));
  mu += mu_t;

  mu *= mach / re;
  thermal_conductivity *= mach / re;

  for (i = 0; i < 3; i++) {
    for (j = 0; j < 3; j++) {
      tau[i][j] = mu * (grad[j + 3 * (1 + i)] + grad[i + 3 * (1 + j)]);
    }
    for (k = 0; k < 3; k++) {
      tau[i][i] += (-2.0 / 3.0) * mu * grad[k + 3 * (1 + k)];
    }
  }

  for (i = 0; i < 3; i++) {
    /* t = gamma * p / rho quotient rule */
    dtdx = gamma * (grad[i + 3 * 4] * rho - p * grad[i + 3 * 0]) / rho / rho;
    qdot[i] = thermal_conductivity * dtdx;
  }

  flux[0] = 0.0;
  flux[1] = dir[0] * tau[0][0] + dir[1] * tau[0][1] + dir[2] * tau[0][2];
  flux[2] = dir[0] * tau[1][0] + dir[1] * tau[1][1] + dir[2] * tau[1][2];
  flux[3] = dir[0] * tau[2][0] + dir[1] * tau[2][1] + dir[2] * tau[2][2];
  flux[4] = dir[0] * (u * tau[0][0] + v * tau[0][1] + w * tau[0][2] - qdot[0]) +
            dir[1] * (u * tau[1][0] + v * tau[1][1] + w * tau[1][2] - qdot[1]) +
            dir[2] * (u * tau[2][0] + v * tau[2][1] + w * tau[2][2] - qdot[2]);

  return REF_SUCCESS;
}